

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prop2octave.cc
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  string inname;
  string outname;
  Parameter param;
  Properties prop;
  string p;
  char *def [6];
  string local_388;
  string local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  Parameter local_328;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_298;
  undefined1 local_268 [8];
  size_type local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258 [14];
  ios_base local_170 [264];
  char *local_68;
  char *pcStack_60;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  undefined8 uStack_40;
  
  local_48 = "-help # Print help and exit.";
  uStack_40 = 0;
  local_58 = "# Converts a property file (i.e. key=value) into octave text format.";
  pcStack_50 = "#";
  local_68 = "# prop2octave <property-file> [<output-file>]";
  pcStack_60 = "#";
  gutil::Parameter::Parameter(&local_328,argc,argv,&local_68,(char *)0x0);
  local_388._M_string_length = 0;
  local_388.field_2._M_local_buf[0] = '\0';
  local_368._M_string_length = 0;
  local_368.field_2._M_local_buf[0] = '\0';
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  do {
    bVar2 = gutil::Parameter::isNextParameter(&local_328);
    if (!bVar2) {
      if ((int)((ulong)((long)local_328.list.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_328.list.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5) - (int)local_328.pos <
          1) {
        iVar3 = 10;
        gutil::Parameter::printHelp(&local_328,(ostream *)&std::cout,0x50);
      }
      else {
        gutil::Parameter::nextString(&local_328,&local_388,(char *)0x0);
        if (0 < (int)((ulong)((long)local_328.list.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_328.list.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5) -
                (int)local_328.pos) {
          gutil::Parameter::nextString(&local_328,&local_368,(char *)0x0);
        }
        gutil::Properties::Properties((Properties *)&local_298,local_388._M_dataplus._M_p);
        if (local_368._M_string_length == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_268,"Converted from ",&local_388);
          gutil::Properties::saveOctave
                    ((Properties *)&local_298,(ostream *)&std::cout,(char *)local_268);
          if (local_268 != (undefined1  [8])local_258) {
            operator_delete((void *)local_268);
          }
        }
        else {
          std::ofstream::ofstream(local_268);
          lVar1 = *(long *)((long)local_268 + -0x18);
          *(undefined4 *)((long)local_258 + lVar1 + 0xc) = 7;
          std::ios::clear((int)&local_388 + (int)lVar1 + 0x120);
          std::ofstream::open((string *)local_268,(_Ios_Openmode)&local_368);
          std::operator+(&local_348,"Converted from ",&local_388);
          gutil::Properties::saveOctave
                    ((Properties *)&local_298,(ostream *)local_268,local_348._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p);
          }
          std::ofstream::close();
          local_268 = (undefined1  [8])_VTT;
          *(undefined8 *)(local_268 + *(long *)(_VTT->_M_local_buf + -0x18)) = _memcpy;
          std::filebuf::~filebuf((filebuf *)&local_260);
          std::ios_base::~ios_base(local_170);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_298);
LAB_00107a64:
        iVar3 = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_328.allparam._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328.creat._M_dataplus._M_p != &local_328.creat.field_2) {
        operator_delete(local_328.creat._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_328.def);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_328.list);
      return iVar3;
    }
    local_260 = 0;
    local_258[0]._M_local_buf[0] = '\0';
    local_268 = (undefined1  [8])local_258;
    gutil::Parameter::nextParameter(&local_328,(string *)local_268);
    iVar3 = std::__cxx11::string::compare((char *)local_268);
    if (iVar3 == 0) {
      gutil::Parameter::printHelp(&local_328,(ostream *)&std::cout,0x50);
      if (local_268 != (undefined1  [8])local_258) {
        operator_delete((void *)local_268);
      }
      goto LAB_00107a64;
    }
    if (local_268 != (undefined1  [8])local_258) {
      operator_delete((void *)local_268);
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
  try
  {
    const char *def[]=
    {
      "# prop2octave <property-file> [<output-file>]",
      "#",
      "# Converts a property file (i.e. key=value) into octave text format.",
      "#",
      "-help # Print help and exit.",
      0
    };

    gutil::Parameter param(argc, argv, def);

    // handle options

    std::string inname;
    std::string outname;

    while (param.isNextParameter())
    {
      std::string p;

      param.nextParameter(p);

      if (p == "-help")
      {
        param.printHelp(std::cout);
        return 0;
      }
    }

    if (param.remaining() < 1)
    {
      param.printHelp(std::cout);
      return 10;
    }

    param.nextString(inname);

    if (param.remaining() > 0)
    {
      param.nextString(outname);
    }

    // load properties file

    gutil::Properties prop(inname.c_str());

    if (outname.size() > 0)
    {
      std::ofstream out;

      out.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
      out.open(outname);

      prop.saveOctave(out, ("Converted from "+inname).c_str());

      out.close();
    }
    else
    {
      prop.saveOctave(std::cout, ("Converted from "+inname).c_str());
    }
  }
  catch (const std::exception &ex)
  {
    std::cerr << ex.what() << std::endl;
  }
}